

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void find_coreGL(void)

{
  GLubyte *pGVar1;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  int minor;
  int major;
  char *v;
  
  pGVar1 = (*glad_glGetString)(0x1f02);
  GLVersion.major = (char)*pGVar1 + -0x30;
  GLVersion.minor = (char)pGVar1[2] + -0x30;
  if ((GLVersion.major != 1) || (local_19 = true, GLVersion.minor < 0)) {
    local_19 = 1 < GLVersion.major;
  }
  GLAD_GL_VERSION_1_0 = (uint)local_19;
  if ((GLVersion.major != 1) || (local_1a = true, GLVersion.minor < 1)) {
    local_1a = 1 < GLVersion.major;
  }
  GLAD_GL_VERSION_1_1 = (uint)local_1a;
  if ((GLVersion.major != 1) || (local_1b = true, GLVersion.minor < 2)) {
    local_1b = 1 < GLVersion.major;
  }
  GLAD_GL_VERSION_1_2 = (uint)local_1b;
  if ((GLVersion.major != 1) || (local_1c = true, GLVersion.minor < 3)) {
    local_1c = 1 < GLVersion.major;
  }
  GLAD_GL_VERSION_1_3 = (uint)local_1c;
  if ((GLVersion.major != 1) || (local_1d = true, GLVersion.minor < 4)) {
    local_1d = 1 < GLVersion.major;
  }
  GLAD_GL_VERSION_1_4 = (uint)local_1d;
  if ((GLVersion.major != 1) || (local_1e = true, GLVersion.minor < 5)) {
    local_1e = 1 < GLVersion.major;
  }
  GLAD_GL_VERSION_1_5 = (uint)local_1e;
  if ((GLVersion.major != 2) || (local_1f = true, GLVersion.minor < 0)) {
    local_1f = 2 < GLVersion.major;
  }
  GLAD_GL_VERSION_2_0 = (uint)local_1f;
  if ((GLVersion.major != 2) || (local_20 = true, GLVersion.minor < 1)) {
    local_20 = 2 < GLVersion.major;
  }
  GLAD_GL_VERSION_2_1 = (uint)local_20;
  if ((GLVersion.major != 3) || (local_21 = true, GLVersion.minor < 0)) {
    local_21 = 3 < GLVersion.major;
  }
  GLAD_GL_VERSION_3_0 = (uint)local_21;
  if ((GLVersion.major != 3) || (local_22 = true, GLVersion.minor < 1)) {
    local_22 = 3 < GLVersion.major;
  }
  GLAD_GL_VERSION_3_1 = (uint)local_22;
  if ((GLVersion.major != 3) || (local_23 = true, GLVersion.minor < 2)) {
    local_23 = 3 < GLVersion.major;
  }
  GLAD_GL_VERSION_3_2 = (uint)local_23;
  return;
}

Assistant:

static void find_coreGL(void) {
	const char *v = (const char *)glGetString(GL_VERSION);
	int major = v[0] - '0';
	int minor = v[2] - '0';
	GLVersion.major = major; GLVersion.minor = minor;
	GLAD_GL_VERSION_1_0 = (major == 1 && minor >= 0) || major > 1;
	GLAD_GL_VERSION_1_1 = (major == 1 && minor >= 1) || major > 1;
	GLAD_GL_VERSION_1_2 = (major == 1 && minor >= 2) || major > 1;
	GLAD_GL_VERSION_1_3 = (major == 1 && minor >= 3) || major > 1;
	GLAD_GL_VERSION_1_4 = (major == 1 && minor >= 4) || major > 1;
	GLAD_GL_VERSION_1_5 = (major == 1 && minor >= 5) || major > 1;
	GLAD_GL_VERSION_2_0 = (major == 2 && minor >= 0) || major > 2;
	GLAD_GL_VERSION_2_1 = (major == 2 && minor >= 1) || major > 2;
	GLAD_GL_VERSION_3_0 = (major == 3 && minor >= 0) || major > 3;
	GLAD_GL_VERSION_3_1 = (major == 3 && minor >= 1) || major > 3;
	GLAD_GL_VERSION_3_2 = (major == 3 && minor >= 2) || major > 3;
}